

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_alter_table.cpp
# Opt level: O2

unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true> __thiscall
duckdb::Transformer::TransformAlter(Transformer *this,PGAlterTableStmt *stmt)

{
  PGAlterTableType PVar1;
  PGNode *pPVar2;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var3;
  pointer pbVar4;
  bool bVar5;
  PGAlterTableCmd *pPVar6;
  ColumnDefinition *column;
  pointer pAVar7;
  reference args_1;
  PGColumnDef *pPVar8;
  PGList *pPVar9;
  reference name;
  LogicalType *pLVar10;
  NotImplementedException *pNVar11;
  InternalException *pIVar12;
  ParserException *pPVar13;
  long in_RDX;
  undefined8 *puVar14;
  pointer *__ptr;
  Transformer *pTVar15;
  _Alloc_hider _Var16;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> oVar17;
  string *name_p;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names_1;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> column_def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  optional_ptr<duckdb_libpgquery::PGList,_true> column_name_list;
  allocator local_241;
  undefined1 local_240 [40];
  ColumnDefinition column_entry;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> command;
  AlterEntryData data;
  string local_d0;
  undefined1 local_b0 [32];
  QualifiedName qualified_name;
  
  if (*(int *)(*(long *)(in_RDX + 0x10) + 4) != 1) {
    pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&column_entry,"Only one ALTER command per statement is supported",
               (allocator *)&data);
    ParserException::ParserException(pPVar13,&column_entry.name);
    __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  make_uniq<duckdb::AlterStatement>();
  TransformQualifiedName(&qualified_name,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  puVar14 = *(undefined8 **)(in_RDX + 0x10);
  do {
    name_p = (string *)(local_240 + 8);
    puVar14 = (undefined8 *)puVar14[1];
    if (puVar14 == (undefined8 *)0x0) {
      QualifiedName::~QualifiedName(&qualified_name);
      return (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)
             (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)this;
    }
    command.ptr = (PGAlterTableCmd *)*puVar14;
    ::std::__cxx11::string::string((string *)local_b0,(string *)&qualified_name);
    ::std::__cxx11::string::string((string *)&local_d0,(string *)&qualified_name.schema);
    ::std::__cxx11::string::string((string *)name_p,(string *)&qualified_name.name);
    pTVar15 = (Transformer *)local_b0;
    AlterEntryData::AlterEntryData
              (&data,(string *)local_b0,&local_d0,name_p,*(OnEntryNotFound *)(in_RDX + 0x1c));
    ::std::__cxx11::string::~string((string *)name_p);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)local_b0);
    pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
    PVar1 = pPVar6->subtype;
    switch(PVar1) {
    case PG_AT_AddColumn:
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      column_name_list.ptr = *(PGList **)&pPVar6->def_list->head->data;
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      column_def.ptr = *(PGColumnDef **)&pPVar6->def_list->tail->data;
      if (*(int *)(in_RDX + 0x18) != 0x26) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_entry,"Adding columns is only supported for tables",
                   (allocator *)&column_names_1);
        ParserException::ParserException(pPVar13,&column_entry.name);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->(&column_def);
      if (pPVar8->category == COL_GENERATED) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_entry,
                   "Adding generated columns after table creation is not supported yet",
                   (allocator *)&column_names_1);
        ParserException::ParserException(pPVar13,&column_entry.name);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator*(&column_def);
      pTVar15 = (Transformer *)stmt;
      TransformColumnDefinition(&column_entry,(Transformer *)stmt,pPVar8);
      pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->(&column_def);
      if (pPVar8->constraints != (PGList *)0x0) {
        pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->(&column_def);
        pPVar9 = pPVar8->constraints;
        while (pPVar9 = (PGList *)pPVar9->head, pPVar9 != (PGList *)0x0) {
          column_names.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)pPVar9;
          column = (ColumnDefinition *)
                   optional_ptr<duckdb_libpgquery::PGConstraint,_true>::operator*
                             ((optional_ptr<duckdb_libpgquery::PGConstraint,_true> *)&column_names);
          pTVar15 = (Transformer *)stmt;
          TransformConstraint((Transformer *)local_240,(PGConstraint *)stmt,column,
                              (idx_t)&column_entry);
          if ((Transformer *)local_240._0_8_ != (Transformer *)0x0) {
            pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&column_names_1,"Adding columns with constraints not yet supported"
                       ,&local_241);
            ParserException::ParserException(pPVar13,(string *)&column_names_1);
            __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      pPVar9 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator*(&column_name_list);
      TransformNameList_abi_cxx11_(&column_names,pTVar15,pPVar9);
      if (column_names.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          column_names.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_names_1,"Expected a name",(allocator *)local_240);
        InternalException::InternalException(pIVar12,(string *)&column_names_1);
        __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::back(&column_names);
      ColumnDefinition::SetName(&column_entry,name);
      if ((long)column_names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)column_names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        make_uniq<duckdb::AddColumnInfo,duckdb::AlterEntryData,duckdb::ColumnDefinition,bool&>
                  ((duckdb *)&column_names_1,&data,&column_entry,&pPVar6->missing_ok);
        _Var18._M_head_impl =
             (AlterInfo *)
             column_names_1.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        column_names_1.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
      }
      else {
        column_names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             column_names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        ::std::__cxx11::string::~string
                  ((string *)
                   column_names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        make_uniq<duckdb::AddFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,duckdb::ColumnDefinition,bool&>
                  ((duckdb *)&column_names_1,&data,&column_names,&column_entry,&pPVar6->missing_ok);
        _Var18._M_head_impl =
             (AlterInfo *)
             column_names_1.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        column_names_1.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
      }
      _Var3._M_head_impl =
           (pAVar7->info).
           super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
           super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var18._M_head_impl;
      if (_Var3._M_head_impl != (AlterInfo *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
      }
      if (column_names_1.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((column_names_1.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names);
LAB_0066448a:
      ColumnDefinition::~ColumnDefinition(&column_entry);
      break;
    case PG_AT_AddColumnRecurse:
    case PG_AT_AddColumnToView:
    case PG_AT_SetStatistics:
    case PG_AT_SetOptions:
    case PG_AT_ResetOptions:
    case PG_AT_SetStorage:
    case PG_AT_DropColumnRecurse:
    case PG_AT_AddIndex:
    case PG_AT_ReAddIndex:
switchD_00663c32_caseD_1:
      pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&column_entry,"No support for that ALTER TABLE option yet!",
                 (allocator *)&column_names_1);
      NotImplementedException::NotImplementedException(pNVar11,&column_entry.name);
      __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case PG_AT_ColumnDefault:
      optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      TransformExpression((Transformer *)&column_names_1,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
      if (*(int *)(in_RDX + 0x18) != 0x26) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_entry,"Alter column\'s default is only supported for tables",
                   (allocator *)&column_names);
        ParserException::ParserException(pPVar13,&column_entry.name);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      make_uniq<duckdb::SetDefaultInfo,duckdb::AlterEntryData,char*&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((duckdb *)&column_entry,&data,&pPVar6->name,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&column_names_1);
      _Var16 = column_entry.name._M_dataplus;
      column_entry.name._M_dataplus._M_p = (pointer)0x0;
      pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
               ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                             *)this);
      _Var18._M_head_impl =
           (pAVar7->info).
           super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
           super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)_Var16._M_p;
      _Var16 = column_entry.name._M_dataplus;
      if (_Var18._M_head_impl != (AlterInfo *)0x0) {
        (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
        _Var16 = column_entry.name._M_dataplus;
      }
      goto LAB_0066402e;
    case PG_AT_DropNotNull:
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      make_uniq<duckdb::DropNotNullInfo,duckdb::AlterEntryData,char*&>
                ((duckdb *)&column_entry,&data,&pPVar6->name);
      _Var18._M_head_impl = (AlterInfo *)column_entry.name._M_dataplus;
      column_entry.name._M_dataplus._M_p = (pointer)0x0;
      pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
               ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                             *)this);
      goto LAB_00663ed6;
    case PG_AT_SetNotNull:
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      make_uniq<duckdb::SetNotNullInfo,duckdb::AlterEntryData,char*&>
                ((duckdb *)&column_entry,&data,&pPVar6->name);
      _Var18._M_head_impl = (AlterInfo *)column_entry.name._M_dataplus;
      column_entry.name._M_dataplus._M_p = (pointer)0x0;
      pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
               ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                             *)this);
LAB_00663ed6:
      _Var3._M_head_impl =
           (pAVar7->info).
           super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
           super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var18._M_head_impl;
      if (_Var3._M_head_impl != (AlterInfo *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
      }
      _Var16._M_p = column_entry.name._M_dataplus._M_p;
      if (column_entry.name._M_dataplus._M_p == (pointer)0x0) break;
      goto LAB_0066404b;
    case PG_AT_DropColumn:
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(column_names.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             pPVar6->behavior == PG_DROP_CASCADE);
      if (*(int *)(in_RDX + 0x18) != 0x26) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_entry,"Dropping columns is only supported for tables",
                   (allocator *)&column_names_1);
        ParserException::ParserException(pPVar13,&column_entry.name);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      TransformNameList_abi_cxx11_(&column_names_1,pTVar15,pPVar6->def_list);
      if (column_names_1.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          column_names_1.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_entry,"Expected a name",(allocator *)&column_name_list);
        InternalException::InternalException(pIVar12,&column_entry.name);
        __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((long)column_names_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)column_names_1.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        args_1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&column_names_1,0);
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        make_uniq<duckdb::RemoveColumnInfo,duckdb::AlterEntryData,std::__cxx11::string&,bool&,bool&>
                  ((duckdb *)&column_entry,&data,args_1,&pPVar6->missing_ok,(bool *)&column_names);
        _Var18._M_head_impl = (AlterInfo *)column_entry.name._M_dataplus;
        column_entry.name._M_dataplus._M_p = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
      }
      else {
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        make_uniq<duckdb::RemoveFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,bool&,bool&>
                  ((duckdb *)&column_entry,&data,&column_names_1,&pPVar6->missing_ok,
                   (bool *)&column_names);
        _Var18._M_head_impl = (AlterInfo *)column_entry.name._M_dataplus;
        column_entry.name._M_dataplus._M_p = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
      }
      _Var3._M_head_impl =
           (pAVar7->info).
           super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
           super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var18._M_head_impl;
      if (_Var3._M_head_impl != (AlterInfo *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
      }
      if (column_entry.name._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)column_entry.name._M_dataplus._M_p + 8))();
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names_1);
      break;
    case PG_AT_AddConstraint:
      pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
      switchD_00917c1c::default(&column_entry,pPVar6->def,0xa8);
      if (column_entry.name._M_dataplus._M_p._4_4_ != 5) {
        pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&column_names_1,"No support for that ALTER TABLE option yet!",
                   (allocator *)&column_names);
        NotImplementedException::NotImplementedException(pNVar11,(string *)&column_names_1);
        __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      TransformConstraint((Transformer *)&column_names_1,(PGConstraint *)stmt);
      make_uniq<duckdb::AddConstraintInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((duckdb *)&column_names,&data,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 &column_names_1);
      pbVar4 = column_names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
               ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                             *)this);
      _Var18._M_head_impl =
           (pAVar7->info).
           super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
           super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)pbVar4;
      _Var16._M_p = (pointer)column_names.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
      if (_Var18._M_head_impl != (AlterInfo *)0x0) {
        (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
        _Var16._M_p = (pointer)column_names.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
      }
LAB_0066402e:
      if ((pointer)_Var16._M_p != (pointer)0x0) {
        (**(code **)((((pointer)_Var16._M_p)->_M_dataplus)._M_p + 8))();
      }
      _Var16._M_p = (pointer)column_names_1.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
      if (column_names_1.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_0066404b:
        (**(code **)((((pointer)_Var16._M_p)->_M_dataplus)._M_p + 8))();
      }
      break;
    default:
      if (PVar1 == PG_AT_AlterColumnType) {
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        column_name_list.ptr = (PGList *)pPVar6->def;
        pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator*
                           ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&column_name_list)
        ;
        TransformColumnDefinition(&column_entry,(Transformer *)stmt,pPVar8);
        column_def.ptr = (PGColumnDef *)0x0;
        if (*(int *)(in_RDX + 0x18) != 0x26) {
          pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&column_names_1,"Alter column\'s type is only supported for tables",
                     (allocator *)&column_names);
          ParserException::ParserException(pPVar13,(string *)&column_names_1);
          __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ColumnDefinition::GetType((LogicalType *)&column_names_1,&column_entry);
        LogicalType::LogicalType((LogicalType *)&column_names,UNKNOWN);
        bVar5 = LogicalType::operator==((LogicalType *)&column_names_1,(LogicalType *)&column_names)
        ;
        if (bVar5) {
          pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->
                             ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)
                              &column_name_list);
          pPVar2 = pPVar8->raw_default;
          LogicalType::~LogicalType((LogicalType *)&column_names);
          LogicalType::~LogicalType((LogicalType *)&column_names_1);
          if (pPVar2 == (PGNode *)0x0) {
            pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&column_names_1,
                       "Omitting the type is only possible in combination with USING",
                       (allocator *)&column_names);
            ParserException::ParserException(pPVar13,(string *)&column_names_1);
            __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          LogicalType::~LogicalType((LogicalType *)&column_names);
          LogicalType::~LogicalType((LogicalType *)&column_names_1);
        }
        pPVar8 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->
                           ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&column_name_list)
        ;
        if (pPVar8->raw_default == (PGNode *)0x0) {
          pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
          make_uniq<duckdb::ColumnRefExpression,char*&>((duckdb *)&column_names_1,&pPVar6->name);
          pLVar10 = ColumnDefinition::Type(&column_entry);
          make_uniq<duckdb::CastExpression,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ColumnRefExpression,std::default_delete<duckdb::ColumnRefExpression>,true>>
                    ((duckdb *)&column_names,pLVar10,
                     (unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                      *)&column_names_1);
          pbVar4 = column_names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          oVar17 = column_def;
          column_names.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          column_def.ptr = (PGColumnDef *)pbVar4;
          if ((oVar17.ptr != (PGColumnDef *)0x0) &&
             ((**(code **)(*(long *)oVar17.ptr + 8))(),
             oVar17.ptr = (PGColumnDef *)
                          column_names.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
             column_names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) goto LAB_006643f4;
LAB_006643fa:
          if (column_names_1.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(((column_names_1.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
          }
        }
        else {
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->
                    ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&column_name_list);
          TransformExpression((Transformer *)&column_names_1,
                              (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
          oVar17 = column_def;
          column_def.ptr =
               (PGColumnDef *)
               column_names_1.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          column_names_1.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          if (oVar17.ptr != (PGColumnDef *)0x0) {
LAB_006643f4:
            (**(code **)(*(long *)oVar17.ptr + 8))();
            goto LAB_006643fa;
          }
        }
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        pLVar10 = ColumnDefinition::Type(&column_entry);
        make_uniq<duckdb::ChangeColumnTypeInfo,duckdb::AlterEntryData,char*&,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((duckdb *)&column_names_1,&data,&pPVar6->name,pLVar10,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&column_def);
        pbVar4 = column_names_1.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        column_names_1.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
        _Var18._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)pbVar4;
        if (_Var18._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
        }
        if (column_names_1.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((column_names_1.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
        }
        if (column_def.ptr != (PGColumnDef *)0x0) {
          (**(code **)(*(long *)column_def.ptr + 8))();
        }
        goto LAB_0066448a;
      }
      if (PVar1 == PG_AT_SetPartitionedBy) {
        column_entry.name._M_dataplus._M_p = (pointer)0x0;
        column_entry.name._M_string_length = 0;
        column_entry.name.field_2._M_allocated_capacity = 0;
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        if (pPVar6->def_list != (PGList *)0x0) {
          pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
          TransformExpressionList
                    ((Transformer *)stmt,pPVar6->def_list,
                     (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)&column_entry);
        }
        make_uniq<duckdb::SetPartitionedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)&column_names_1,&data,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&column_entry);
        pbVar4 = column_names_1.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        column_names_1.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
        _Var18._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)pbVar4;
        if (_Var18._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
        }
        if (column_names_1.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((column_names_1.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&column_entry);
      }
      else {
        if (PVar1 != PG_AT_SetSortedBy) goto switchD_00663c32_caseD_1;
        column_entry.name._M_dataplus._M_p = (pointer)0x0;
        column_entry.name._M_string_length = 0;
        column_entry.name.field_2._M_allocated_capacity = 0;
        pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
        if (pPVar6->def_list != (PGList *)0x0) {
          pPVar6 = optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::operator->(&command);
          TransformOrderBy((Transformer *)stmt,pPVar6->def_list,
                           (vector<duckdb::OrderByNode,_true> *)&column_entry);
        }
        make_uniq<duckdb::SetSortedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::OrderByNode,true>>
                  ((duckdb *)&column_names_1,&data,
                   (vector<duckdb::OrderByNode,_true> *)&column_entry);
        pbVar4 = column_names_1.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        column_names_1.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pAVar7 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                 ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                               *)this);
        _Var18._M_head_impl =
             (pAVar7->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar7->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)pbVar4;
        if (_Var18._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
        }
        if (column_names_1.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((column_names_1.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
        }
        ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
                  ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                   &column_entry);
      }
    }
    AlterEntryData::~AlterEntryData(&data);
  } while( true );
}

Assistant:

unique_ptr<AlterStatement> Transformer::TransformAlter(duckdb_libpgquery::PGAlterTableStmt &stmt) {

	D_ASSERT(stmt.relation);
	if (stmt.cmds->length != 1) {
		throw ParserException("Only one ALTER command per statement is supported");
	}

	auto result = make_uniq<AlterStatement>();
	auto qualified_name = TransformQualifiedName(*stmt.relation);

	// Check the ALTER type.
	for (auto c = stmt.cmds->head; c != nullptr; c = c->next) {

		auto command = PGPointerCast<duckdb_libpgquery::PGAlterTableCmd>(c->data.ptr_value);
		AlterEntryData data(qualified_name.catalog, qualified_name.schema, qualified_name.name,
		                    TransformOnEntryNotFound(stmt.missing_ok));

		switch (command->subtype) {
		case duckdb_libpgquery::PG_AT_AddColumn: {
			auto column_name_list = PGPointerCast<duckdb_libpgquery::PGList>(command->def_list->head->data.ptr_value);
			auto column_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(command->def_list->tail->data.ptr_value);
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Adding columns is only supported for tables");
			}
			if (column_def->category == duckdb_libpgquery::COL_GENERATED) {
				throw ParserException("Adding generated columns after table creation is not supported yet");
			}
			auto column_entry = TransformColumnDefinition(*column_def);
			if (column_def->constraints) {
				for (auto cell = column_def->constraints->head; cell != nullptr; cell = cell->next) {
					auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(cell->data.ptr_value);
					auto constraint = TransformConstraint(*pg_constraint, column_entry, 0);
					if (!constraint) {
						continue;
					}
					throw ParserException("Adding columns with constraints not yet supported");
				}
			}
			auto column_names = TransformNameList(*column_name_list);
			if (column_names.empty()) {
				throw InternalException("Expected a name");
			}
			column_entry.SetName(column_names.back());
			if (column_names.size() == 1) {
				// ADD COLUMN
				result->info = make_uniq<AddColumnInfo>(std::move(data), std::move(column_entry), command->missing_ok);
			} else {
				// ADD FIELD
				column_names.pop_back();
				result->info = make_uniq<AddFieldInfo>(std::move(data), std::move(column_names),
				                                       std::move(column_entry), command->missing_ok);
			}
			break;
		}
		case duckdb_libpgquery::PG_AT_DropColumn: {
			auto cascade = command->behavior == duckdb_libpgquery::PG_DROP_CASCADE;
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Dropping columns is only supported for tables");
			}
			auto column_names = TransformNameList(*command->def_list);
			if (column_names.empty()) {
				throw InternalException("Expected a name");
			}
			if (column_names.size() == 1) {
				result->info =
				    make_uniq<RemoveColumnInfo>(std::move(data), column_names[0], command->missing_ok, cascade);
			} else {
				result->info =
				    make_uniq<RemoveFieldInfo>(std::move(data), std::move(column_names), command->missing_ok, cascade);
			}
			break;
		}
		case duckdb_libpgquery::PG_AT_ColumnDefault: {
			auto expr = TransformExpression(command->def);
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Alter column's default is only supported for tables");
			}
			result->info = make_uniq<SetDefaultInfo>(std::move(data), command->name, std::move(expr));
			break;
		}
		case duckdb_libpgquery::PG_AT_AlterColumnType: {
			auto column_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(command->def);
			auto column_entry = TransformColumnDefinition(*column_def);

			unique_ptr<ParsedExpression> expr;
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Alter column's type is only supported for tables");
			}

			if (column_entry.GetType() == LogicalType::UNKNOWN && !column_def->raw_default) {
				throw ParserException("Omitting the type is only possible in combination with USING");
			}

			if (column_def->raw_default) {
				expr = TransformExpression(column_def->raw_default);
			} else {
				auto col_ref = make_uniq<ColumnRefExpression>(command->name);
				expr = make_uniq<CastExpression>(column_entry.Type(), std::move(col_ref));
			}
			result->info =
			    make_uniq<ChangeColumnTypeInfo>(std::move(data), command->name, column_entry.Type(), std::move(expr));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetNotNull: {
			result->info = make_uniq<SetNotNullInfo>(std::move(data), command->name);
			break;
		}
		case duckdb_libpgquery::PG_AT_DropNotNull: {
			result->info = make_uniq<DropNotNullInfo>(std::move(data), command->name);
			break;
		}
		case duckdb_libpgquery::PG_AT_AddConstraint: {
			auto pg_constraint = PGCast<duckdb_libpgquery::PGConstraint>(*command->def);
			if (pg_constraint.contype != duckdb_libpgquery::PGConstrType::PG_CONSTR_PRIMARY) {
				throw NotImplementedException("No support for that ALTER TABLE option yet!");
			}

			auto constraint = TransformConstraint(pg_constraint);
			result->info = make_uniq<AddConstraintInfo>(std::move(data), std::move(constraint));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetPartitionedBy: {
			vector<unique_ptr<ParsedExpression>> partition_keys;
			if (command->def_list) {
				TransformExpressionList(*command->def_list, partition_keys);
			}
			result->info = make_uniq<SetPartitionedByInfo>(std::move(data), std::move(partition_keys));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetSortedBy: {
			vector<OrderByNode> orders;
			if (command->def_list) {
				TransformOrderBy(command->def_list, orders);
			}
			result->info = make_uniq<SetSortedByInfo>(std::move(data), std::move(orders));
			break;
		}
		default:
			throw NotImplementedException("No support for that ALTER TABLE option yet!");
		}
	}
	return result;
}